

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

int __thiscall QMetaObject::indexOfSlot(QMetaObject *this,char *slot)

{
  QMetaObject *pQVar1;
  int iVar2;
  int iVar3;
  QArgumentType *in_R9;
  long in_FS_OFFSET;
  QByteArrayView name;
  QByteArrayView QVar4;
  QMetaObject *m;
  QArgumentTypeArray types;
  QMetaObject *local_180;
  undefined1 local_178 [344];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_180 = this;
  memset((QArgumentTypeArray *)local_178,0xaa,0x158);
  local_178._0_8_ = 10;
  local_178._8_8_ = 0;
  local_178._16_8_ = (QArgumentType *)(local_178 + 0x18);
  QVar4 = QMetaObjectPrivate::decodeMethodSignature(slot,(QArgumentTypeArray *)local_178);
  name.m_size = QVar4.m_data;
  name.m_data._0_4_ = local_178._8_4_;
  name.m_data._4_4_ = 0;
  iVar2 = QMetaObjectPrivate::indexOfSlotRelative
                    ((QMetaObjectPrivate *)&local_180,(QMetaObject **)QVar4.m_size,name,
                     (int)local_178._16_8_,in_R9);
  if (-1 < iVar2) {
    iVar3 = 0;
    for (pQVar1 = (local_180->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
        pQVar1 = (pQVar1->d).superdata.direct) {
      iVar3 = iVar3 + (pQVar1->d).data[4];
    }
    iVar2 = iVar3 + iVar2;
  }
  std::_Destroy_n_aux<false>::__destroy_n<QArgumentType*,long_long>
            ((QArgumentType *)local_178._16_8_,local_178._8_8_);
  if ((QArgumentType *)local_178._16_8_ != (QArgumentType *)(local_178 + 0x18)) {
    QtPrivate::sizedFree((void *)local_178._16_8_,local_178._0_8_ << 5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QMetaObject::indexOfSlot(const char *slot) const
{
    const QMetaObject *m = this;
    int i;
    Q_ASSERT(priv(m->d.data)->revision >= 7);
    QArgumentTypeArray types;
    QByteArrayView name = QMetaObjectPrivate::decodeMethodSignature(slot, types);
    i = QMetaObjectPrivate::indexOfSlotRelative(&m, name, types.size(), types.constData());
    if (i >= 0)
        i += m->methodOffset();
    return i;
}